

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Members * __thiscall
Json::Value::getMemberNames_abi_cxx11_(Members *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  runtime_error *this_00;
  size_type __n;
  reference this_01;
  char *pcVar2;
  allocator local_69;
  value_type local_68;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_40;
  const_iterator itEnd;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_30;
  const_iterator it;
  Value *this_local;
  Members *members;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 7)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::getMemberNames(), value must be objectValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    it._M_node._3_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    __n = std::
          map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::size((this->value_).map_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,__n);
    itEnd._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::begin((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_30,(iterator *)&itEnd);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_40,&local_48);
    while (bVar1 = std::operator!=(&local_30,&local_40), bVar1) {
      this_01 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                operator*(&local_30);
      pcVar2 = CZString::c_str(&this_01->first);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,pcVar2,&local_69);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
                (&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value::Members Value::getMemberNames() const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::getMemberNames(), value must be objectValue");
  if (type_ == nullValue)
    return Value::Members();
  Members members;
  members.reserve(value_.map_->size());
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ObjectValues::const_iterator it = value_.map_->begin();
  ObjectValues::const_iterator itEnd = value_.map_->end();
  for (; it != itEnd; ++it)
    members.push_back(std::string((*it).first.c_str()));
#else
  ValueInternalMap::IteratorState it;
  ValueInternalMap::IteratorState itEnd;
  value_.map_->makeBeginIterator(it);
  value_.map_->makeEndIterator(itEnd);
  for (; !ValueInternalMap::equals(it, itEnd); ValueInternalMap::increment(it))
    members.push_back(std::string(ValueInternalMap::key(it)));
#endif
  return members;
}